

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUFA.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_234::GUFAOptimizer::visitFunction(GUFAOptimizer *this,Function *func)

{
  Function *pFVar1;
  Module *pMVar2;
  PassRunner *runner_00;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  PassRunner runner;
  ReFinalize local_158;
  Function *local_18;
  Function *func_local;
  GUFAOptimizer *this_local;
  
  if ((this->optimized & 1U) != 0) {
    local_18 = func;
    func_local = (Function *)this;
    ReFinalize::ReFinalize(&local_158);
    pFVar1 = local_18;
    pMVar2 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                        );
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_158.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               pFVar1,pMVar2);
    ReFinalize::~ReFinalize(&local_158);
    pFVar1 = local_18;
    pMVar2 = Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
             ::getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>_>
                          ).
                          super_PostWalker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                          .
                          super_Walker<wasm::(anonymous_namespace)::GUFAOptimizer,_wasm::UnifiedExpressionVisitor<wasm::(anonymous_namespace)::GUFAOptimizer,_void>_>
                        );
    EHUtils::handleBlockNestedPops(pFVar1,pMVar2);
    if ((this->optimizing & 1U) != 0) {
      runner_00 = Pass::getPassRunner((Pass *)this);
      PassRunner::PassRunner((PassRunner *)local_280,runner_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"dce",&local_2a1);
      PassRunner::add((PassRunner *)local_280,&local_2a0);
      std::__cxx11::string::~string((string *)&local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"vacuum",&local_2c9);
      PassRunner::add((PassRunner *)local_280,&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
      PassRunner::runOnFunction((PassRunner *)local_280,local_18);
      PassRunner::~PassRunner((PassRunner *)local_280);
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (!optimized) {
      return;
    }

    // Optimization may introduce more unreachables, which we need to
    // propagate.
    ReFinalize().walkFunctionInModule(func, getModule());

    // We may add blocks around pops, which we must fix up.
    EHUtils::handleBlockNestedPops(func, *getModule());

    // If we are in "optimizing" mode, we'll also run some more passes on this
    // function that we just optimized. If not, leave now.
    if (!optimizing) {
      return;
    }

    PassRunner runner(getPassRunner());
    // New unreachables we added have created dead code we can remove. If we do
    // not do this, then running GUFA repeatedly can actually increase code size
    // (by adding multiple unneeded unreachables).
    runner.add("dce");
    // New drops we added allow us to remove more unused code and values. As
    // with unreachables, without a vacuum we may increase code size as in
    // nested expressions we may apply the same value multiple times:
    //
    //  (block $out
    //   (block $in
    //    (i32.const 10)))
    //
    // In each of the blocks we'll infer the value must be 10, so we'll end up
    // with this repeating code:
    //
    //  (block ;; a new block just to drop the old outer block
    //   (drop
    //    (block $out
    //     (drop
    //      (block $in
    //       (i32.const 10)
    //      )
    //     )
    //     (i32.const 10)
    //    )
    //   )
    //   (i32.const 10)
    //  )
    runner.add("vacuum");
    runner.runOnFunction(func);
  }